

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall
ThreadContext::AsyncHostOperationEnd(ThreadContext *this,bool wasInAsync,void *suspendRecord)

{
  ScriptEntryExitRecord *pSVar1;
  code *pcVar2;
  bool bVar3;
  byte bVar4;
  undefined4 *puVar5;
  
  if (this->isScriptActive == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                       ,0xfea,"(!this->IsScriptActive())","!this->IsScriptActive()");
    if (!bVar3) goto LAB_007b5bd3;
    *puVar5 = 0;
  }
  pSVar1 = this->entryExitRecord;
  if (pSVar1 != (ScriptEntryExitRecord *)0x0) {
    bVar4 = *(byte *)pSVar1;
    if ((bVar4 & 8) == 0) {
      if ((bVar4 & 0x10) == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                           ,0xff0,"(lastRecord->leaveForAsyncHostOperation)",
                           "lastRecord->leaveForAsyncHostOperation");
        if (!bVar3) {
LAB_007b5bd3:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
        bVar4 = *(byte *)pSVar1;
      }
      *(byte *)pSVar1 = bVar4 & 0xef | wasInAsync << 4;
      Js::ScriptContext::ProfileResume(pSVar1->scriptContext,(SuspendRecord *)suspendRecord);
      return;
    }
    if ((bVar4 & 0x10) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0xffa,"(!lastRecord->leaveForAsyncHostOperation)",
                         "!lastRecord->leaveForAsyncHostOperation");
      if (!bVar3) goto LAB_007b5bd3;
      *puVar5 = 0;
    }
    if (wasInAsync) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
                         ,0xffb,"(!wasInAsync)","!wasInAsync");
      if (!bVar3) goto LAB_007b5bd3;
      *puVar5 = 0;
    }
  }
  return;
}

Assistant:

void
ThreadContext::AsyncHostOperationEnd(bool wasInAsync, void * suspendRecord)
{
    Assert(!this->IsScriptActive());
    Js::ScriptEntryExitRecord * lastRecord = this->entryExitRecord;
    if (lastRecord != NULL)
    {
        if (!lastRecord->leaveForHost)
        {
            Assert(lastRecord->leaveForAsyncHostOperation);
#if DBG
            lastRecord->leaveForAsyncHostOperation = wasInAsync;
#endif
#ifdef PROFILE_EXEC
            lastRecord->scriptContext->ProfileResume((Js::Profiler::SuspendRecord *)suspendRecord);
#endif
        }
        else
        {
            Assert(!lastRecord->leaveForAsyncHostOperation);
            Assert(!wasInAsync);
        }
    }
}